

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O1

void pull_subfield_end(uchar **cursor,size_t *max,uchar *subcursor,size_t submax)

{
  uchar *puVar1;
  uchar *puVar2;
  
  if (subcursor == (uchar *)0x0) {
    *cursor = (uchar *)0x0;
    *max = 0;
  }
  else {
    puVar1 = *cursor;
    if (puVar1 != (uchar *)0x0) {
      if (subcursor < puVar1) {
        __assert_fail("subcursor >= *cursor",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/libwally-core/src/pullpush.c"
                      ,0xb4,
                      "void pull_subfield_end(const unsigned char **, size_t *, const unsigned char *, size_t)"
                     );
      }
      puVar2 = subcursor + submax;
      if (puVar1 + *max < puVar2) {
        __assert_fail("subend <= *cursor + *max",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/libwally-core/src/pullpush.c"
                      ,0xb5,
                      "void pull_subfield_end(const unsigned char **, size_t *, const unsigned char *, size_t)"
                     );
      }
      *max = (size_t)(puVar1 + (*max - (long)puVar2));
      *cursor = puVar2;
    }
  }
  return;
}

Assistant:

void pull_subfield_end(const unsigned char **cursor, size_t *max,
                       const unsigned char *subcursor, size_t submax)
{
    if (subcursor == NULL) {
        pull_failed(cursor, max);
    } else if (*cursor != NULL) {
        const unsigned char *subend = subcursor + submax;
        assert(subcursor >= *cursor);
        assert(subend <= *cursor + *max);
        *max -= (subend - *cursor);
        *cursor = subend;
    }
}